

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

PropertyIndex __thiscall
Js::SimpleTypeHandler<2UL>::GetPropertyIndex
          (SimpleTypeHandler<2UL> *this,PropertyRecord *propertyRecord)

{
  ushort uVar1;
  
  if (0 < this->propertyCount) {
    uVar1 = 0;
    do {
      if ((this->descriptors[uVar1].Id.ptr)->pid == propertyRecord->pid) {
        if ((this->descriptors[uVar1].field_1.Attributes & 8) != 0) {
          return 0xffff;
        }
        return uVar1;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)uVar1 < (uint)this->propertyCount);
  }
  return 0xffff;
}

Assistant:

PropertyIndex SimpleTypeHandler<size>::GetPropertyIndex(PropertyRecord const* propertyRecord)
    {
        PropertyIndex index;
        if (GetDescriptor(propertyRecord->GetPropertyId(), &index) && !(descriptors[index].Attributes & PropertyDeleted))
        {
            return (PropertyIndex)index;
        }
        return Constants::NoSlot;
    }